

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xpathInternals(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  undefined8 uVar50;
  xmlXPathObjectPtr pxVar51;
  FILE *pFVar52;
  xmlXPathObjectPtr pxVar53;
  xmlXPathObjectPtr pxVar54;
  xmlNodePtr pxVar55;
  long lVar56;
  undefined4 uVar57;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int nr_19;
  int nr_20;
  int nr_21;
  int nr_22;
  undefined8 uVar58;
  int n_cur;
  int iVar59;
  ulong uVar60;
  ulong uVar61;
  int n_value;
  uint uVar62;
  uint uVar63;
  undefined4 uVar64;
  xmlXPathObjectPtr in_RSI;
  xmlNodePtr pxVar65;
  int test_ret_4;
  int iVar66;
  undefined8 *puVar67;
  int test_ret_3;
  undefined4 *puVar68;
  uint *puVar69;
  int n_depth_1;
  int n_ns;
  bool bVar70;
  int test_ret;
  int test_ret_2;
  int test_ret_1;
  int test_ret_7;
  int test_ret_6;
  int local_54;
  ulong local_50;
  int local_44;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing xpathInternals : 106 of 117 functions ...");
  }
  iVar1 = xmlMemBlocks();
  uVar50 = valuePop(0);
  xmlXPathFreeObject(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in valuePop");
    in_RSI = (xmlXPathObjectPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar62 = 0;
  local_54 = 0;
  do {
    iVar4 = (int)in_RSI;
    iVar3 = xmlMemBlocks();
    pxVar51 = gen_xmlXPathObjectPtr(uVar62,iVar4);
    in_RSI = pxVar51;
    valuePush(0);
    call_tests = call_tests + 1;
    if (pxVar51 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar51);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in valuePush",(ulong)(uint)(iVar4 - iVar3));
      local_54 = local_54 + 1;
      printf(" %d",0);
      in_RSI = (xmlXPathObjectPtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlXPathAddValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathAddValues",(ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  local_44 = 0;
  do {
    iVar5 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathBooleanFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathBooleanFunction",(ulong)(uint)(iVar6 - iVar5));
      local_44 = local_44 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathCeilingFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCeilingFunction",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar62 = 0;
  do {
    puVar68 = &DAT_00157254;
    uVar63 = 0;
    do {
      iVar7 = xmlMemBlocks();
      uVar57 = 0xffffffff;
      uVar64 = 0xffffffff;
      if (uVar62 < 4) {
        uVar64 = (&DAT_00157254)[uVar62];
      }
      if (uVar63 < 4) {
        uVar57 = *puVar68;
      }
      xmlXPathCompareValues(0,uVar64,uVar57);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathCompareValues",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar62);
        printf(" %d",(ulong)uVar63);
        putchar(10);
      }
      uVar63 = uVar63 + 1;
      puVar68 = puVar68 + 1;
    } while (uVar63 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 4);
  iVar1 = local_54 + (uint)(iVar1 != iVar2) + (uint)(iVar3 != iVar4) + local_44;
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathConcatFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathConcatFunction",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathContainsFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar4 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathContainsFunction",(ulong)(uint)(iVar7 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  local_3c = 0;
  do {
    iVar7 = xmlMemBlocks();
    xmlXPathCountFunction(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCountFunction",(ulong)(uint)(iVar8 - iVar7));
      local_3c = local_3c + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 4);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar62 = 0;
  do {
    puVar68 = &DAT_00157254;
    uVar63 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar62 == 0) {
        pFVar52 = fopen64("test.out","a+");
      }
      else {
        pFVar52 = (FILE *)0x0;
      }
      uVar64 = 0xffffffff;
      if (uVar63 < 4) {
        uVar64 = *puVar68;
      }
      pxVar51 = (xmlXPathObjectPtr)0x0;
      xmlXPathDebugDumpCompExpr(pFVar52,0,uVar64);
      call_tests = call_tests + 1;
      if (pFVar52 != (FILE *)0x0) {
        fclose(pFVar52);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar4 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathDebugDumpCompExpr",(ulong)(uint)(iVar7 - iVar4));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d",0);
        pxVar51 = (xmlXPathObjectPtr)(ulong)uVar63;
        printf(" %d");
        putchar(10);
      }
      uVar63 = uVar63 + 1;
      puVar68 = puVar68 + 1;
    } while (uVar63 != 4);
    bVar70 = uVar62 == 0;
    uVar62 = uVar62 + 1;
  } while (bVar70);
  function_tests = function_tests + 1;
  local_44 = 0;
  local_50 = 0;
  do {
    uVar62 = 0;
    do {
      pxVar54 = (xmlXPathObjectPtr)0x0;
      puVar68 = &DAT_00157254;
      do {
        iVar7 = (int)pxVar51;
        iVar4 = xmlMemBlocks();
        if ((uint)local_50 == 0) {
          iVar7 = 0x14bac0;
          pFVar52 = fopen64("test.out","a+");
        }
        else {
          pFVar52 = (FILE *)0x0;
        }
        pxVar53 = gen_xmlXPathObjectPtr(uVar62,iVar7);
        uVar64 = 0xffffffff;
        uVar63 = (uint)pxVar54;
        if (uVar63 < 4) {
          uVar64 = *puVar68;
        }
        pxVar51 = pxVar53;
        xmlXPathDebugDumpObject(pFVar52,pxVar53,uVar64);
        call_tests = call_tests + 1;
        if (pFVar52 != (FILE *)0x0) {
          fclose(pFVar52);
        }
        if (pxVar53 != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject(pxVar53);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar4 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathDebugDumpObject",(ulong)(uint)(iVar7 - iVar4));
          local_44 = local_44 + 1;
          printf(" %d",local_50);
          printf(" %d",(ulong)uVar62);
          printf(" %d");
          putchar(10);
          pxVar51 = pxVar54;
        }
        uVar63 = uVar63 + 1;
        pxVar54 = (xmlXPathObjectPtr)(ulong)uVar63;
        puVar68 = puVar68 + 1;
      } while (uVar63 != 4);
      uVar62 = uVar62 + 1;
    } while (uVar62 != 5);
    bVar70 = (uint)local_50 == 0;
    local_50 = (ulong)((uint)local_50 + 1);
  } while (bVar70);
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  uVar50 = xmlXPathDifference(0,0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar4 != iVar7) {
    iVar8 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathDifference",(ulong)(uint)(iVar8 - iVar4));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  uVar50 = xmlXPathDistinct(0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    iVar10 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathDistinct",(ulong)(uint)(iVar10 - iVar8));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  uVar50 = xmlXPathDistinctSorted(0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    iVar12 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathDistinctSorted",(ulong)(uint)(iVar12 - iVar10));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  xmlXPathDivValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    iVar14 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathDivValues",(ulong)(uint)(iVar14 - iVar12));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  xmlXPathEqualValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar14 != iVar15) {
    iVar16 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathEqualValues",(ulong)(uint)(iVar16 - iVar14));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar69 = &DAT_00157254;
  uVar62 = 0;
  iVar16 = 0;
  do {
    iVar17 = xmlMemBlocks();
    pxVar51 = (xmlXPathObjectPtr)0xffffffff;
    if (uVar62 < 4) {
      pxVar51 = (xmlXPathObjectPtr)(ulong)*puVar69;
    }
    xmlXPathErr(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathErr",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      printf(" %d",0);
      pxVar51 = (xmlXPathObjectPtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar69 = puVar69 + 1;
  } while (uVar62 != 4);
  local_50._0_4_ = (uint)(iVar14 != iVar15);
  iVar3 = iVar1 + iVar5 + iVar6 + iVar2 + iVar3 + local_3c + local_40 + local_44 +
          (uint)(iVar4 != iVar7) + (uint)(iVar8 != iVar9) + (uint)(iVar10 != iVar11) +
          (uint)(iVar12 != iVar13) + (uint)local_50;
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  xmlXPathEvalExpr(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathEvalExpr");
    pxVar51 = (xmlXPathObjectPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar4 = 0;
  do {
    iVar6 = (int)pxVar51;
    iVar5 = xmlMemBlocks();
    pxVar54 = gen_xmlXPathObjectPtr(uVar62,iVar6);
    pxVar51 = pxVar54;
    xmlXPathEvaluatePredicateResult(0);
    call_tests = call_tests + 1;
    if (pxVar54 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar54);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathEvaluatePredicateResult",
             (ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",0);
      pxVar51 = (xmlXPathObjectPtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathFalseFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathFalseFunction",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathFloorFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathFloorFunction",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlXPathHasSameNodes(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathHasSameNodes",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathIdFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIdFunction",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  local_50._0_4_ = (uint)(iVar7 != iVar8);
  iVar3 = iVar3 + iVar16 + (uint)(iVar1 != iVar2) + iVar4 + iVar5 + iVar6 + (uint)local_50;
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  uVar50 = xmlXPathIntersection(0,0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar4 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathIntersection",(ulong)(uint)(iVar4 - iVar1));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar67 = &DAT_00159d60;
  uVar62 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar50 = *puVar67;
    }
    else {
      uVar50 = 0;
    }
    xmlXPathIsNodeType(uVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIsNodeType",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar67 = puVar67 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathLangFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathLangFunction",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathLastFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathLastFunction",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  uVar50 = xmlXPathLeading(0,0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar10 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathLeading",(ulong)(uint)(iVar10 - iVar7));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  uVar50 = xmlXPathLeadingSorted(0,0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    iVar12 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathLeadingSorted",(ulong)(uint)(iVar12 - iVar10));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar12 = 0;
  do {
    iVar13 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathLocalNameFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathLocalNameFunction",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar13 = xmlMemBlocks();
  xmlXPathModValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar14 = xmlMemBlocks();
  if (iVar13 != iVar14) {
    iVar15 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathModValues",(ulong)(uint)(iVar15 - iVar13));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  xmlXPathMultValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    iVar17 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathMultValues",(ulong)(uint)(iVar17 - iVar15));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar69 = &DAT_00157254;
  uVar62 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    pxVar65 = (xmlNodePtr)0xffffffff;
    if (uVar62 < 4) {
      pxVar65 = (xmlNodePtr)(ulong)*puVar69;
    }
    xmlXPathNamespaceURIFunction(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNamespaceURIFunction",
             (ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar69 = puVar69 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    uVar50 = xmlXPathNewBoolean(uVar64);
    xmlXPathFreeObject(uVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewBoolean",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar67 = &DAT_00159d48;
  uVar62 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    if (uVar62 < 3) {
      uVar50 = *puVar67;
    }
    else {
      uVar50 = 0;
    }
    xmlXPathNewCString(uVar50);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewCString",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar67 = puVar67 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar20 = 0;
  do {
    iVar21 = xmlMemBlocks();
    if (uVar62 == 0) {
      uVar50 = 0;
    }
    else {
      uVar50 = _xmlXPathNAN;
      if (uVar62 != 2) {
        if (uVar62 == 1) {
          uVar50 = 0xbff199999999999a;
        }
        else {
          uVar50 = 0xbff0000000000000;
        }
      }
    }
    uVar50 = xmlXPathNewFloat(uVar50);
    xmlXPathFreeObject(uVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewFloat",(ulong)(uint)(iVar22 - iVar21));
      iVar20 = iVar20 + 1;
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar21 = 0;
  do {
    iVar23 = (int)pxVar65;
    iVar22 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar23);
    uVar50 = xmlXPathNewNodeSet(pxVar65);
    xmlXPathFreeObject(uVar50);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr);
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewNodeSet",(ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar22 = xmlMemBlocks();
  uVar50 = xmlXPathNewNodeSetList(0);
  xmlXPathFreeObject(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar23 = xmlMemBlocks();
  if (iVar22 != iVar23) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathNewNodeSetList");
    pxVar65 = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar67 = &DAT_00159d60;
  uVar62 = 0;
  iVar59 = 0;
  do {
    iVar24 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar50 = *puVar67;
    }
    else {
      uVar50 = 0;
    }
    xmlXPathNewString(uVar50);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar25 = xmlMemBlocks();
    if (iVar24 != iVar25) {
      iVar25 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNewString",(ulong)(uint)(iVar25 - iVar24));
      iVar59 = iVar59 + 1;
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar67 = puVar67 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar24 = 0;
  do {
    iVar26 = (int)pxVar65;
    iVar25 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar26);
    pxVar55 = (xmlNodePtr)xmlXPathNextAncestor(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_00);
    xmlResetLastError();
    iVar26 = xmlMemBlocks();
    if (iVar25 != iVar26) {
      iVar26 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextAncestor",(ulong)(uint)(iVar26 - iVar25));
      iVar24 = iVar24 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  local_50._0_4_ = (uint)(iVar22 != iVar23);
  iVar1 = iVar3 + iVar9 + (uint)(iVar1 != iVar2) + iVar4 + iVar5 + iVar6 + (uint)(iVar7 != iVar8) +
          (uint)(iVar10 != iVar11) + iVar12 + (uint)(iVar13 != iVar14) + (uint)(iVar15 != iVar16) +
          iVar17 + iVar18 + iVar19 + iVar20 + iVar21 + (uint)local_50;
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar2 = 0;
  do {
    iVar4 = (int)pxVar65;
    iVar3 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar4);
    pxVar55 = (xmlNodePtr)xmlXPathNextAncestorOrSelf(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_01);
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextAncestorOrSelf",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar3 = 0;
  do {
    iVar5 = (int)pxVar65;
    iVar4 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar5);
    pxVar55 = (xmlNodePtr)xmlXPathNextAttribute(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_02);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextAttribute",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar4 = 0;
  do {
    iVar6 = (int)pxVar65;
    iVar5 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar6);
    pxVar55 = (xmlNodePtr)xmlXPathNextChild(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_03);
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextChild",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar5 = 0;
  do {
    iVar7 = (int)pxVar65;
    iVar6 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar7);
    pxVar55 = (xmlNodePtr)xmlXPathNextDescendant(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_04);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextDescendant",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar6 = 0;
  do {
    iVar8 = (int)pxVar65;
    iVar7 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar8);
    pxVar55 = (xmlNodePtr)xmlXPathNextDescendantOrSelf(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_05);
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextDescendantOrSelf",(ulong)(uint)(iVar8 - iVar7))
      ;
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar7 = 0;
  do {
    iVar9 = (int)pxVar65;
    iVar8 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar9);
    pxVar55 = (xmlNodePtr)xmlXPathNextFollowing(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_06);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextFollowing",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar8 = 0;
  do {
    iVar10 = (int)pxVar65;
    iVar9 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar10);
    pxVar55 = (xmlNodePtr)xmlXPathNextFollowingSibling(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_07);
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextFollowingSibling",(ulong)(uint)(iVar10 - iVar9)
            );
      iVar8 = iVar8 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar9 = 0;
  do {
    iVar11 = (int)pxVar65;
    iVar10 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar11);
    pxVar55 = (xmlNodePtr)xmlXPathNextNamespace(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_08);
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextNamespace",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar10 = 0;
  do {
    iVar12 = (int)pxVar65;
    iVar11 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar12);
    pxVar55 = (xmlNodePtr)xmlXPathNextParent(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_09);
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextParent",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar11 = 0;
  do {
    iVar13 = (int)pxVar65;
    iVar12 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar13);
    pxVar55 = (xmlNodePtr)xmlXPathNextPreceding(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_10);
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextPreceding",(ulong)(uint)(iVar13 - iVar12));
      iVar11 = iVar11 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar12 = 0;
  do {
    iVar14 = (int)pxVar65;
    iVar13 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar14);
    pxVar55 = (xmlNodePtr)xmlXPathNextPrecedingSibling(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_11);
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextPrecedingSibling",
             (ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar13 = 0;
  do {
    iVar15 = (int)pxVar65;
    iVar14 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar15);
    pxVar55 = (xmlNodePtr)xmlXPathNextSelf(0,pxVar65);
    desret_xmlNodePtr(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_12);
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNextSelf",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar14 = 0;
  do {
    iVar16 = (int)pxVar65;
    iVar15 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar16);
    uVar50 = xmlXPathNodeLeading(0,pxVar65);
    xmlXPathFreeNodeSet(uVar50);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_13);
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeLeading",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  local_44 = 0;
  do {
    iVar16 = (int)pxVar65;
    iVar15 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar16);
    uVar50 = xmlXPathNodeLeadingSorted(0,pxVar65);
    xmlXPathFreeNodeSet(uVar50);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_14);
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeLeadingSorted",(ulong)(uint)(iVar16 - iVar15));
      local_44 = local_44 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  local_40 = 0;
  do {
    iVar16 = (int)pxVar65;
    iVar15 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar16);
    xmlXPathNodeSetAdd(0,pxVar65);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_15);
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetAdd",(ulong)(uint)(iVar16 - iVar15));
      local_40 = local_40 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar62 = 0;
  do {
    uVar63 = 0;
    do {
      iVar17 = (int)pxVar65;
      iVar16 = xmlMemBlocks();
      pxVar65 = gen_xmlNodePtr(uVar62,iVar17);
      if (uVar63 == 0) {
        get_api_root();
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
        }
        xmlXPathNodeSetAddNs(0,pxVar65,api_ns);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar62,pxVar65,nr_17);
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      else {
        xmlXPathNodeSetAddNs(0,pxVar65,0);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar62,pxVar65,nr_16);
      }
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetAddNs",(ulong)(uint)(iVar17 - iVar16));
        iVar15 = iVar15 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar62);
        pxVar65 = (xmlNodePtr)(ulong)uVar63;
        printf(" %d");
        putchar(10);
      }
      uVar63 = uVar63 + 1;
    } while (uVar63 == 1);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar16 = 0;
  do {
    iVar18 = (int)pxVar65;
    iVar17 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar18);
    xmlXPathNodeSetAddUnique(0,pxVar65);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_18);
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetAddUnique",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar17 = 0;
  do {
    iVar19 = (int)pxVar65;
    iVar18 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar19);
    xmlXPathNodeSetContains(0,pxVar65);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_19);
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetContains",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar18 = 0;
  do {
    iVar20 = (int)pxVar65;
    iVar19 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar20);
    xmlXPathNodeSetDel(0,pxVar65);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_20);
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetDel",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar19 = xmlMemBlocks();
  uVar50 = xmlXPathNodeSetMerge(0,0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar19 != iVar20) {
    iVar21 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathNodeSetMerge",(ulong)(uint)(iVar21 - iVar19));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar69 = &DAT_00157254;
  uVar62 = 0;
  iVar21 = 0;
  do {
    iVar22 = xmlMemBlocks();
    pxVar65 = (xmlNodePtr)0xffffffff;
    if (uVar62 < 4) {
      pxVar65 = (xmlNodePtr)(ulong)*puVar69;
    }
    xmlXPathNodeSetRemove(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetRemove",(ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar69 = puVar69 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar22 = xmlMemBlocks();
  xmlXPathNodeSetSort(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar23 = xmlMemBlocks();
  if (iVar22 != iVar23) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathNodeSetSort");
    pxVar65 = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar25 = 0;
  do {
    iVar27 = (int)pxVar65;
    iVar26 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar27);
    uVar50 = xmlXPathNodeTrailing(0,pxVar65);
    xmlXPathFreeNodeSet(uVar50);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_21);
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeTrailing",(ulong)(uint)(iVar27 - iVar26));
      iVar25 = iVar25 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar26 = 0;
  do {
    iVar28 = (int)pxVar65;
    iVar27 = xmlMemBlocks();
    pxVar65 = gen_xmlNodePtr(uVar62,iVar28);
    uVar50 = xmlXPathNodeTrailingSorted(0,pxVar65);
    xmlXPathFreeNodeSet(uVar50);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar62,pxVar65,nr_22);
    xmlResetLastError();
    iVar28 = xmlMemBlocks();
    if (iVar27 != iVar28) {
      iVar28 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeTrailingSorted",(ulong)(uint)(iVar28 - iVar27))
      ;
      iVar26 = iVar26 + 1;
      printf(" %d",0);
      pxVar65 = (xmlNodePtr)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar27 = 0;
  do {
    iVar28 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathNormalizeFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar29 = xmlMemBlocks();
    if (iVar28 != iVar29) {
      iVar29 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNormalizeFunction",(ulong)(uint)(iVar29 - iVar28));
      iVar27 = iVar27 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar28 = xmlMemBlocks();
  xmlXPathNotEqualValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar29 = xmlMemBlocks();
  if (iVar28 != iVar29) {
    iVar30 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathNotEqualValues",(ulong)(uint)(iVar30 - iVar28));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar30 = 0;
  do {
    iVar31 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathNotFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNotFunction",(ulong)(uint)(iVar32 - iVar31));
      iVar30 = iVar30 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar67 = &DAT_00159d60;
  uVar62 = 0;
  iVar31 = 0;
  do {
    iVar32 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar50 = *puVar67;
    }
    else {
      uVar50 = 0;
    }
    xmlXPathNsLookup(0,uVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar33 = xmlMemBlocks();
    if (iVar32 != iVar33) {
      iVar33 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNsLookup",(ulong)(uint)(iVar33 - iVar32));
      iVar31 = iVar31 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar67 = puVar67 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar32 = 0;
  do {
    iVar33 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathNumberFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar34 = xmlMemBlocks();
    if (iVar33 != iVar34) {
      iVar34 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNumberFunction",(ulong)(uint)(iVar34 - iVar33));
      iVar32 = iVar32 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar33 = xmlMemBlocks();
  lVar56 = xmlXPathParseNCName(0);
  if (lVar56 != 0) {
    (*_xmlFree)(lVar56);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar34 = xmlMemBlocks();
  if (iVar33 != iVar34) {
    iVar35 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathParseNCName",(ulong)(uint)(iVar35 - iVar33));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar35 = xmlMemBlocks();
  lVar56 = xmlXPathParseName(0);
  if (lVar56 != 0) {
    (*_xmlFree)(lVar56);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar36 = xmlMemBlocks();
  if (iVar35 != iVar36) {
    iVar37 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathParseName",(ulong)(uint)(iVar37 - iVar35));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar37 = xmlMemBlocks();
  xmlXPathPopBoolean(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar38 = xmlMemBlocks();
  if (iVar37 != iVar38) {
    iVar39 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopBoolean",(ulong)(uint)(iVar39 - iVar37));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar39 = xmlMemBlocks();
  xmlXPathPopExternal(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar40 = xmlMemBlocks();
  if (iVar39 != iVar40) {
    iVar41 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopExternal",(ulong)(uint)(iVar41 - iVar39));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar41 = xmlMemBlocks();
  uVar50 = xmlXPathPopNodeSet(0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar42 = xmlMemBlocks();
  if (iVar41 != iVar42) {
    iVar43 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopNodeSet",(ulong)(uint)(iVar43 - iVar41));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar43 = xmlMemBlocks();
  xmlXPathPopNumber(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar44 = xmlMemBlocks();
  if (iVar43 != iVar44) {
    iVar45 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopNumber",(ulong)(uint)(iVar45 - iVar43));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar45 = xmlMemBlocks();
  lVar56 = xmlXPathPopString(0);
  if (lVar56 != 0) {
    (*_xmlFree)(lVar56);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar46 = xmlMemBlocks();
  if (iVar45 != iVar46) {
    iVar47 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathPopString",(ulong)(uint)(iVar47 - iVar45));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar47 = 0;
  iVar66 = 0;
  do {
    iVar48 = xmlMemBlocks();
    xmlXPathPositionFunction(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar49 = xmlMemBlocks();
    if (iVar48 != iVar49) {
      iVar49 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathPositionFunction",(ulong)(uint)(iVar49 - iVar48));
      iVar66 = iVar66 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar47 = iVar47 + 1;
  } while (iVar47 != 4);
  local_50._0_4_ = (uint)(iVar45 != iVar46);
  iVar3 = iVar1 + iVar59 + iVar24 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + iVar9 +
          iVar10 + iVar11 + iVar12 + iVar13 + iVar14 + local_44 + local_40 + iVar15 + iVar16 +
          iVar17 + iVar18 + (uint)(iVar19 != iVar20) + iVar21 + (uint)(iVar22 != iVar23) + iVar25 +
          iVar26 + iVar27 + (uint)(iVar28 != iVar29) + iVar30 + iVar31 + iVar32 +
          (uint)(iVar33 != iVar34) + (uint)(iVar35 != iVar36) + (uint)(iVar37 != iVar38) +
          (uint)(iVar39 != iVar40) + (uint)(iVar41 != iVar42) + (uint)(iVar43 != iVar44) +
          (uint)local_50;
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  xmlXPathRegisterAllFunctions(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRegisterAllFunctions");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar62 = 0;
  do {
    uVar63 = 0;
    puVar67 = &DAT_00159d60;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar62 < 4) {
        uVar60 = (&DAT_00159d60)[uVar62];
      }
      else {
        uVar60 = 0;
      }
      if (uVar63 < 4) {
        uVar50 = *puVar67;
      }
      else {
        uVar50 = 0;
      }
      xmlXPathRegisterNs(0,uVar60,uVar50);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathRegisterNs",(ulong)(uint)(iVar5 - iVar4));
        local_3c = local_3c + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar62);
        uVar60 = (ulong)uVar63;
        printf(" %d");
        putchar(10);
      }
      uVar63 = uVar63 + 1;
      puVar67 = puVar67 + 1;
    } while (uVar63 != 5);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  local_38 = &DAT_00159d60;
  local_40 = 0;
  uVar62 = 0;
  do {
    uVar63 = 0;
    do {
      iVar5 = (int)uVar60;
      iVar4 = xmlMemBlocks();
      if (uVar62 < 4) {
        uVar60 = (&DAT_00159d60)[uVar62];
      }
      else {
        uVar60 = 0;
      }
      pxVar51 = gen_xmlXPathObjectPtr(uVar63,iVar5);
      xmlXPathRegisterVariable(0,uVar60,pxVar51);
      call_tests = call_tests + 1;
      if (pxVar51 != (xmlXPathObjectPtr)0x0) {
        xmlXPathFreeObject(pxVar51);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathRegisterVariable",(ulong)(uint)(iVar5 - iVar4));
        local_40 = local_40 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar62);
        uVar60 = (ulong)uVar63;
        printf(" %d");
        putchar(10);
      }
      uVar63 = uVar63 + 1;
    } while (uVar63 != 5);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  local_50._0_4_ = (uint)(iVar1 != iVar2);
  iVar1 = iVar3 + iVar66 + (uint)local_50;
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar62 = 0;
  do {
    uVar61 = 0;
    do {
      uVar63 = 0;
      do {
        iVar3 = (int)uVar60;
        iVar2 = xmlMemBlocks();
        if (uVar62 < 4) {
          uVar60 = (&DAT_00159d60)[uVar62];
        }
        else {
          uVar60 = 0;
        }
        if ((uint)uVar61 < 4) {
          uVar50 = (&DAT_00159d60)[uVar61];
        }
        else {
          uVar50 = 0;
        }
        pxVar51 = gen_xmlXPathObjectPtr(uVar63,iVar3);
        xmlXPathRegisterVariableNS(0,uVar60,uVar50,pxVar51);
        call_tests = call_tests + 1;
        if (pxVar51 != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject(pxVar51);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathRegisterVariableNS",
                 (ulong)(uint)(iVar3 - iVar2));
          local_44 = local_44 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar62);
          printf(" %d",uVar61);
          uVar60 = (ulong)uVar63;
          printf(" %d");
          putchar(10);
        }
        uVar63 = uVar63 + 1;
      } while (uVar63 != 5);
      uVar63 = (uint)uVar61 + 1;
      uVar61 = (ulong)uVar63;
    } while (uVar63 != 5);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  xmlXPathRegisteredFuncsCleanup(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    iVar4 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRegisteredFuncsCleanup",(ulong)(uint)(iVar4 - iVar2))
    ;
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlXPathRegisteredNsCleanup(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRegisteredNsCleanup",(ulong)(uint)(iVar6 - iVar4));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlXPathRegisteredVariablesCleanup(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    iVar8 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRegisteredVariablesCleanup",
           (ulong)(uint)(iVar8 - iVar6));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  xmlXPathRoot(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    iVar10 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathRoot",(ulong)(uint)(iVar10 - iVar8));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathRoundFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathRoundFunction",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathStartsWithFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStartsWithFunction",(ulong)(uint)(iVar13 - iVar12))
      ;
      iVar11 = iVar11 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar12 = 0;
  do {
    iVar13 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar50 = *local_38;
    }
    else {
      uVar50 = 0;
    }
    xmlXPathStringEvalNumber(uVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStringEvalNumber",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    local_38 = local_38 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathStringFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStringFunction",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathStringLengthFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathStringLengthFunction",
             (ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  xmlXPathSubValues(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    iVar17 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathSubValues",(ulong)(uint)(iVar17 - iVar15));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathSubstringAfterFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSubstringAfterFunction",
             (ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathSubstringBeforeFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSubstringBeforeFunction",
             (ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathSubstringFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSubstringFunction",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar20 = 0;
  do {
    iVar21 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathSumFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSumFunction",(ulong)(uint)(iVar22 - iVar21));
      iVar20 = iVar20 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar21 = xmlMemBlocks();
  uVar50 = xmlXPathTrailing(0,0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar22 = xmlMemBlocks();
  if (iVar21 != iVar22) {
    iVar23 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathTrailing",(ulong)(uint)(iVar23 - iVar21));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar23 = xmlMemBlocks();
  uVar50 = xmlXPathTrailingSorted(0,0);
  xmlXPathFreeNodeSet(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar59 = xmlMemBlocks();
  if (iVar23 != iVar59) {
    iVar24 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathTrailingSorted",(ulong)(uint)(iVar24 - iVar23));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar24 = 0;
  do {
    iVar25 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathTranslateFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar26 = xmlMemBlocks();
    if (iVar25 != iVar26) {
      iVar26 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathTranslateFunction",(ulong)(uint)(iVar26 - iVar25));
      iVar24 = iVar24 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  puVar68 = &DAT_00157254;
  uVar62 = 0;
  iVar25 = 0;
  do {
    iVar26 = xmlMemBlocks();
    uVar64 = 0xffffffff;
    if (uVar62 < 4) {
      uVar64 = *puVar68;
    }
    xmlXPathTrueFunction(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathTrueFunction",(ulong)(uint)(iVar27 - iVar26));
      iVar25 = iVar25 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar68 = puVar68 + 1;
  } while (uVar62 != 4);
  local_50._0_4_ = (uint)(iVar23 != iVar59);
  function_tests = function_tests + 1;
  iVar23 = xmlMemBlocks();
  xmlXPathValueFlipSign(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar59 = xmlMemBlocks();
  if (iVar23 != iVar59) {
    iVar26 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathValueFlipSign",(ulong)(uint)(iVar26 - iVar23));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar67 = &DAT_00159d60;
  uVar62 = 0;
  iVar26 = 0;
  do {
    iVar27 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar50 = *puVar67;
    }
    else {
      uVar50 = 0;
    }
    xmlXPathVariableLookup(0,uVar50);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar28 = xmlMemBlocks();
    if (iVar27 != iVar28) {
      iVar28 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathVariableLookup",(ulong)(uint)(iVar28 - iVar27));
      iVar26 = iVar26 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar67 = puVar67 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar62 = 0;
  do {
    puVar67 = &DAT_00159d60;
    uVar63 = 0;
    do {
      iVar28 = xmlMemBlocks();
      if (uVar62 < 4) {
        uVar50 = (&DAT_00159d60)[uVar62];
      }
      else {
        uVar50 = 0;
      }
      if (uVar63 < 4) {
        uVar58 = *puVar67;
      }
      else {
        uVar58 = 0;
      }
      xmlXPathVariableLookupNS(0,uVar50,uVar58);
      xmlXPathFreeObject();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar29 = xmlMemBlocks();
      if (iVar28 != iVar29) {
        iVar29 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathVariableLookupNS",(ulong)(uint)(iVar29 - iVar28))
        ;
        iVar27 = iVar27 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        putchar(10);
      }
      uVar63 = uVar63 + 1;
      puVar67 = puVar67 + 1;
    } while (uVar63 != 5);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar28 = xmlMemBlocks();
  uVar50 = xmlXPathWrapCString(0);
  xmlXPathFreeObject(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar29 = xmlMemBlocks();
  if (iVar28 != iVar29) {
    iVar30 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathWrapCString",(ulong)(uint)(iVar30 - iVar28));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar30 = 0;
  do {
    iVar31 = xmlMemBlocks();
    xmlXPathWrapExternal(0);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathWrapExternal",(ulong)(uint)(iVar32 - iVar31));
      iVar30 = iVar30 + 1;
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 == 1);
  function_tests = function_tests + 1;
  iVar31 = xmlMemBlocks();
  uVar50 = xmlXPathWrapNodeSet(0);
  xmlXPathFreeObject(uVar50);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar32 = xmlMemBlocks();
  if (iVar31 != iVar32) {
    iVar33 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathWrapNodeSet",(ulong)(uint)(iVar33 - iVar31));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar33 = 0;
  uVar62 = 0;
  do {
    uVar60 = 0;
    do {
      puVar68 = &DAT_00157254;
      uVar63 = 0;
      do {
        iVar34 = xmlMemBlocks();
        if (uVar62 < 7) {
          uVar50 = (&DAT_00159d80)[uVar62];
        }
        else {
          uVar50 = 0;
        }
        uVar57 = 0xffffffff;
        uVar64 = 0xffffffff;
        if ((uint)uVar60 < 4) {
          uVar64 = (&DAT_00157254)[uVar60];
        }
        if (uVar63 < 4) {
          uVar57 = *puVar68;
        }
        xmlXPatherror(0,uVar50,uVar64,uVar57);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar35 = xmlMemBlocks();
        if (iVar34 != iVar35) {
          iVar35 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPatherror",(ulong)(uint)(iVar35 - iVar34));
          iVar33 = iVar33 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar62);
          printf(" %d",uVar60);
          printf(" %d");
          putchar(10);
        }
        uVar63 = uVar63 + 1;
        puVar68 = puVar68 + 1;
      } while (uVar63 != 4);
      uVar63 = (uint)uVar60 + 1;
      uVar60 = (ulong)uVar63;
    } while (uVar63 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 8);
  function_tests = function_tests + 1;
  uVar62 = iVar1 + local_3c + local_40 + local_44 + (uint)(iVar2 != iVar3) + (uint)(iVar4 != iVar5)
           + (uint)(iVar6 != iVar7) + (uint)(iVar8 != iVar9) + iVar10 + iVar11 + iVar12 +
           iVar13 + iVar14 + (uint)(iVar15 != iVar16) + iVar17 + iVar18 + iVar19 + iVar20 +
           (uint)(iVar21 != iVar22) + (uint)local_50 + iVar24 + iVar25 + (uint)(iVar23 != iVar59) +
           iVar26 + iVar27 + (uint)(iVar28 != iVar29) + iVar30 + (uint)(iVar31 != iVar32) + iVar33;
  if (uVar62 != 0) {
    printf("Module xpathInternals: %d errors\n",(ulong)uVar62);
  }
  return uVar62;
}

Assistant:

static int
test_xpathInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpathInternals : 106 of 117 functions ...\n");
    test_ret += test_valuePop();
    test_ret += test_valuePush();
    test_ret += test_xmlXPathAddValues();
    test_ret += test_xmlXPathBooleanFunction();
    test_ret += test_xmlXPathCeilingFunction();
    test_ret += test_xmlXPathCompareValues();
    test_ret += test_xmlXPathConcatFunction();
    test_ret += test_xmlXPathContainsFunction();
    test_ret += test_xmlXPathCountFunction();
    test_ret += test_xmlXPathDebugDumpCompExpr();
    test_ret += test_xmlXPathDebugDumpObject();
    test_ret += test_xmlXPathDifference();
    test_ret += test_xmlXPathDistinct();
    test_ret += test_xmlXPathDistinctSorted();
    test_ret += test_xmlXPathDivValues();
    test_ret += test_xmlXPathEqualValues();
    test_ret += test_xmlXPathErr();
    test_ret += test_xmlXPathEvalExpr();
    test_ret += test_xmlXPathEvaluatePredicateResult();
    test_ret += test_xmlXPathFalseFunction();
    test_ret += test_xmlXPathFloorFunction();
    test_ret += test_xmlXPathFunctionLookup();
    test_ret += test_xmlXPathFunctionLookupNS();
    test_ret += test_xmlXPathHasSameNodes();
    test_ret += test_xmlXPathIdFunction();
    test_ret += test_xmlXPathIntersection();
    test_ret += test_xmlXPathIsNodeType();
    test_ret += test_xmlXPathLangFunction();
    test_ret += test_xmlXPathLastFunction();
    test_ret += test_xmlXPathLeading();
    test_ret += test_xmlXPathLeadingSorted();
    test_ret += test_xmlXPathLocalNameFunction();
    test_ret += test_xmlXPathModValues();
    test_ret += test_xmlXPathMultValues();
    test_ret += test_xmlXPathNamespaceURIFunction();
    test_ret += test_xmlXPathNewBoolean();
    test_ret += test_xmlXPathNewCString();
    test_ret += test_xmlXPathNewFloat();
    test_ret += test_xmlXPathNewNodeSet();
    test_ret += test_xmlXPathNewNodeSetList();
    test_ret += test_xmlXPathNewParserContext();
    test_ret += test_xmlXPathNewString();
    test_ret += test_xmlXPathNextAncestor();
    test_ret += test_xmlXPathNextAncestorOrSelf();
    test_ret += test_xmlXPathNextAttribute();
    test_ret += test_xmlXPathNextChild();
    test_ret += test_xmlXPathNextDescendant();
    test_ret += test_xmlXPathNextDescendantOrSelf();
    test_ret += test_xmlXPathNextFollowing();
    test_ret += test_xmlXPathNextFollowingSibling();
    test_ret += test_xmlXPathNextNamespace();
    test_ret += test_xmlXPathNextParent();
    test_ret += test_xmlXPathNextPreceding();
    test_ret += test_xmlXPathNextPrecedingSibling();
    test_ret += test_xmlXPathNextSelf();
    test_ret += test_xmlXPathNodeLeading();
    test_ret += test_xmlXPathNodeLeadingSorted();
    test_ret += test_xmlXPathNodeSetAdd();
    test_ret += test_xmlXPathNodeSetAddNs();
    test_ret += test_xmlXPathNodeSetAddUnique();
    test_ret += test_xmlXPathNodeSetContains();
    test_ret += test_xmlXPathNodeSetDel();
    test_ret += test_xmlXPathNodeSetMerge();
    test_ret += test_xmlXPathNodeSetRemove();
    test_ret += test_xmlXPathNodeSetSort();
    test_ret += test_xmlXPathNodeTrailing();
    test_ret += test_xmlXPathNodeTrailingSorted();
    test_ret += test_xmlXPathNormalizeFunction();
    test_ret += test_xmlXPathNotEqualValues();
    test_ret += test_xmlXPathNotFunction();
    test_ret += test_xmlXPathNsLookup();
    test_ret += test_xmlXPathNumberFunction();
    test_ret += test_xmlXPathParseNCName();
    test_ret += test_xmlXPathParseName();
    test_ret += test_xmlXPathPopBoolean();
    test_ret += test_xmlXPathPopExternal();
    test_ret += test_xmlXPathPopNodeSet();
    test_ret += test_xmlXPathPopNumber();
    test_ret += test_xmlXPathPopString();
    test_ret += test_xmlXPathPositionFunction();
    test_ret += test_xmlXPathRegisterAllFunctions();
    test_ret += test_xmlXPathRegisterFunc();
    test_ret += test_xmlXPathRegisterFuncLookup();
    test_ret += test_xmlXPathRegisterFuncNS();
    test_ret += test_xmlXPathRegisterNs();
    test_ret += test_xmlXPathRegisterVariable();
    test_ret += test_xmlXPathRegisterVariableLookup();
    test_ret += test_xmlXPathRegisterVariableNS();
    test_ret += test_xmlXPathRegisteredFuncsCleanup();
    test_ret += test_xmlXPathRegisteredNsCleanup();
    test_ret += test_xmlXPathRegisteredVariablesCleanup();
    test_ret += test_xmlXPathRoot();
    test_ret += test_xmlXPathRoundFunction();
    test_ret += test_xmlXPathStartsWithFunction();
    test_ret += test_xmlXPathStringEvalNumber();
    test_ret += test_xmlXPathStringFunction();
    test_ret += test_xmlXPathStringLengthFunction();
    test_ret += test_xmlXPathSubValues();
    test_ret += test_xmlXPathSubstringAfterFunction();
    test_ret += test_xmlXPathSubstringBeforeFunction();
    test_ret += test_xmlXPathSubstringFunction();
    test_ret += test_xmlXPathSumFunction();
    test_ret += test_xmlXPathTrailing();
    test_ret += test_xmlXPathTrailingSorted();
    test_ret += test_xmlXPathTranslateFunction();
    test_ret += test_xmlXPathTrueFunction();
    test_ret += test_xmlXPathValueFlipSign();
    test_ret += test_xmlXPathVariableLookup();
    test_ret += test_xmlXPathVariableLookupNS();
    test_ret += test_xmlXPathWrapCString();
    test_ret += test_xmlXPathWrapExternal();
    test_ret += test_xmlXPathWrapNodeSet();
    test_ret += test_xmlXPatherror();

    if (test_ret != 0)
	printf("Module xpathInternals: %d errors\n", test_ret);
    return(test_ret);
}